

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O3

void printDifference<float>
               (Serializer *serializer1,Serializer *serializer2,Savepoint *savepoint,
               DataFieldInfo *info1,DataFieldInfo *info2,IJKLBounds *bounds,
               vector<bool,_std::allocator<bool>_> *failed)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ostream *poVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  bool bVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  float *data2;
  float *data1;
  float *local_78;
  float *local_70;
  double local_68;
  double dStack_60;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  readData<float>(serializer1,info1,savepoint,&local_70);
  readData<float>(serializer2,info2,savepoint,&local_78);
  uVar1 = bounds->iLower;
  uVar2 = bounds->iUpper;
  uVar3 = bounds->jUpper;
  uVar4 = bounds->jLower;
  uVar5 = bounds->kUpper;
  local_40 = (ulong)uVar5;
  uVar6 = bounds->kLower;
  iVar7 = bounds->lUpper;
  iVar8 = bounds->lLower;
  iVar16 = ((iVar7 - iVar8) + 1) * ((uVar5 + 1) - uVar6) *
           ((uVar3 - uVar4) + 1) * ((uVar2 - uVar1) + 1);
  if ((int)uVar2 < (int)uVar1) {
    iVar23 = 0;
    local_68 = 0.0;
    dStack_60 = 0.0;
    iVar19 = 0;
  }
  else {
    iVar9 = info1->lSize_;
    iVar25 = ((info1->jSize_ * uVar1 + uVar4) * info1->kSize_ + uVar6) * iVar9;
    iVar17 = info1->kSize_ * iVar9;
    local_68 = 0.0;
    dStack_60 = 0.0;
    iVar19 = 0;
    iVar23 = 0;
    do {
      local_50 = (ulong)uVar1;
      uVar12 = uVar4;
      iVar21 = iVar25;
      if ((int)uVar4 <= (int)uVar3) {
        do {
          local_38 = (ulong)uVar12;
          uVar22 = (ulong)uVar6;
          iVar20 = iVar21;
          if ((int)uVar6 <= (int)uVar5) {
            do {
              if (iVar8 <= iVar7) {
                uVar18 = (long)iVar20 + (long)iVar8;
                iVar15 = (iVar7 - iVar8) + 1;
                do {
                  iVar11 = (int)uVar18;
                  iVar24 = iVar11 + 0x3f;
                  if (-1 < iVar11) {
                    iVar24 = iVar11;
                  }
                  if (((failed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [(long)(iVar24 >> 6) +
                        (ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff] >> (uVar18 & 0x3f) & 1) != 0) {
                    iVar19 = iVar19 + 1;
                    dVar30 = (double)local_78[uVar18];
                    iVar23 = iVar23 + (uint)(NAN(local_70[uVar18]) || NAN(local_78[uVar18]));
                    dVar27 = (double)local_70[uVar18] - dVar30;
                    auVar28._0_8_ = ABS(dVar27);
                    auVar28._8_8_ = ABS(dVar27 / dVar30);
                    auVar29._8_8_ = dStack_60;
                    auVar29._0_8_ = local_68;
                    auVar29 = maxpd(auVar28,auVar29);
                    local_68 = auVar29._0_8_;
                    dStack_60 = auVar29._8_8_;
                  }
                  uVar18 = uVar18 + 1;
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              uVar22 = uVar22 + 1;
              iVar20 = iVar20 + iVar9;
            } while (uVar5 + 1 != (int)uVar22);
          }
          iVar21 = iVar21 + iVar17;
          bVar26 = uVar12 != uVar3;
          uVar12 = uVar12 + 1;
        } while (bVar26);
      }
      iVar25 = iVar25 + info1->jSize_ * iVar17;
      bVar26 = uVar1 != uVar2;
      uVar1 = uVar1 + 1;
      local_48 = (ulong)uVar6;
    } while (bVar26);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," | Number of values: ",0x15);
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," | Number of errors: ",0x15);
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  if (iVar23 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," | Number of NaN errors: ",0x19);
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 6;
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," | Percentuage of errors: ",0x1a);
  lVar10 = std::cout;
  *(undefined8 *)(__cxa_call_unexpected + *(long *)(std::cout + -0x18)) = 2;
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar10 + -0x18)) =
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar10 + -0x18)) & 0xfffffefb
       | 4;
  poVar13 = std::ostream::_M_insert<double>(((double)iVar19 * 100.0) / (double)iVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," %\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," | Maximum absolute error: ",0x1b);
  lVar14 = std::cout;
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0x11;
  lVar10 = *(long *)(lVar14 + -0x18);
  if ((&DAT_00139361)[lVar10] == '\0') {
    std::ios::widen((char)lVar10 + -0x80);
    (&DAT_00139361)[lVar10] = 1;
    lVar14 = std::cout;
  }
  memmove[lVar10] = (code)0x20;
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar14 + -0x18)) =
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar14 + -0x18)) & 0xfffffefb
       | 0x100;
  *(undefined8 *)(__cxa_call_unexpected + *(long *)(lVar14 + -0x18)) = 10;
  poVar13 = std::ostream::_M_insert<double>(local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," | Maximum relative error: ",0x1b);
  lVar14 = std::cout;
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0x11;
  lVar10 = *(long *)(lVar14 + -0x18);
  if ((&DAT_00139361)[lVar10] == '\0') {
    std::ios::widen((char)lVar10 + -0x80);
    (&DAT_00139361)[lVar10] = 1;
    lVar14 = std::cout;
  }
  memmove[lVar10] = (code)0x20;
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar14 + -0x18)) =
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar14 + -0x18)) & 0xfffffefb
       | 0x100;
  *(undefined8 *)(__cxa_call_unexpected + *(long *)(lVar14 + -0x18)) = 10;
  poVar13 = std::ostream::_M_insert<double>(dStack_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
  if (local_70 != (float *)0x0) {
    operator_delete__(local_70);
  }
  if (local_78 != (float *)0x0) {
    operator_delete__(local_78);
  }
  return;
}

Assistant:

void printDifference(const Serializer& serializer1, const Serializer& serializer2,
                     const Savepoint& savepoint,
                     const DataFieldInfo& info1, const DataFieldInfo& info2,
                     const IJKLBounds& bounds,
                     const vector<bool>& failed)
{
    T* data1;
    readData(serializer1, info1, savepoint, data1);

    T* data2;
    readData(serializer2, info2, savepoint, data2);

    int iSize = info1.iSize();
    int jSize = info1.jSize();
    int kSize = info1.kSize();
    int lSize = info1.lSize();

    int nValues = (bounds.iUpper - bounds.iLower + 1) * (bounds.jUpper - bounds.jLower + 1) *
                  (bounds.kUpper - bounds.kLower + 1) * (bounds.lUpper - bounds.lLower + 1);
    int nErrors = 0;
    unsigned int nNan = 0;

    double maxRelError = 0;
    double maxAbsError = 0;

    for (int i = bounds.iLower; i <= bounds.iUpper; ++i) {
        for (int j = bounds.jLower; j <= bounds.jUpper; ++j) {
            for (int k = bounds.kLower; k <= bounds.kUpper; ++k) {
                for (int l = bounds.lLower; l <= bounds.lUpper; ++l) {
                    int index = i * jSize * kSize * lSize + j * kSize * lSize + k * lSize + l;
                    if (failed[index]) {
                        ++nErrors;

                        const double val = static_cast<double>(data1[index]);
                        const double ref = static_cast<double>(data2[index]);

                        if ((val != val) || (ref != ref)) {
                            ++nNan;
                        }
                        maxAbsError = std::max(maxAbsError, std::fabs(val - ref));
                        maxRelError = std::max(maxRelError, std::fabs((val - ref) / ref));
                    }
                }
            }
        }
    }

    std::cout << " | Number of values: " << std::setw(6) << nValues << "\n";
    std::cout << " | Number of errors: " << std::setw(6) << nErrors << "\n";
    if (nNan > 0) std::cout << " | Number of NaN errors: " << std::setw(6) << nNan << "\n";
    std::cout << " | Percentuage of errors: " << std::setprecision(2) << std::fixed << (100.*nErrors) / nValues << " %\n";
    std::cout << " | Maximum absolute error: " << std::setw(17) << std::setfill(' ') << std::scientific << std::setprecision(10) << maxAbsError  << "\n";
    std::cout << " | Maximum relative error: " << std::setw(17) << std::setfill(' ') << std::scientific << std::setprecision(10) << maxRelError  << "\n";

    delete [] data1;
    delete [] data2;

}